

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O0

CEAngle CECoordinates::AngularSeparation(CECoordinates *coords1,CECoordinates *coords2)

{
  CECoordinates *pCVar1;
  CECoordinateType CVar2;
  CECoordinateType CVar3;
  undefined8 uVar4;
  CECoordinates *in_RDX;
  CECoordinates *in_RSI;
  CEAngle *in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double *angle;
  double extraout_XMM0_Qa_01;
  CEAngle CVar5;
  double y2;
  double y1;
  CEAngle *angsep;
  double *in_stack_fffffffffffffeb8;
  CEAngle *in_stack_fffffffffffffee0;
  CEAngle *in_stack_fffffffffffffee8;
  allocator *paVar6;
  CEAngle *xcoord_first;
  undefined4 in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  invalid_value *in_stack_ffffffffffffff10;
  double *local_e8;
  undefined1 local_e0 [32];
  double local_c0;
  undefined1 local_b8 [16];
  CEAngle local_a8;
  double local_98;
  undefined1 local_89;
  double local_88;
  double local_80;
  undefined1 local_72;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  CECoordinates *local_18;
  CECoordinates *local_10;
  
  xcoord_first = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  CVar2 = GetCoordSystem(in_RSI);
  CVar3 = GetCoordSystem(local_18);
  pCVar1 = local_10;
  if (CVar2 == CVar3) {
    CppEphem::julian_date_J2000();
    (*pCVar1->_vptr_CECoordinates[7])();
    pCVar1 = local_18;
    local_80 = extraout_XMM0_Qa;
    CppEphem::julian_date_J2000();
    (*pCVar1->_vptr_CECoordinates[7])();
    local_88 = extraout_XMM0_Qa_00;
    CVar2 = GetCoordSystem(local_10);
    if (CVar2 == OBSERVED) {
      local_80 = 1.5707963267948966 - local_80;
      local_88 = 1.5707963267948966 - local_88;
    }
    local_89 = 0;
    local_c0 = CppEphem::julian_date_J2000();
    (*local_10->_vptr_CECoordinates[3])(local_b8,local_10,&local_c0);
    CEAngle::CEAngle((CEAngle *)local_10,in_stack_fffffffffffffeb8);
    angle = (double *)CppEphem::julian_date_J2000();
    local_e8 = angle;
    (*local_18->_vptr_CECoordinates[3])(local_e0,local_18,&local_e8);
    CEAngle::CEAngle((CEAngle *)local_10,angle);
    AngularSeparation(xcoord_first,in_RDI,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    local_98 = CEAngle::operator_cast_to_double(&local_a8);
    CEAngle::CEAngle((CEAngle *)local_10,angle);
    CEAngle::~CEAngle((CEAngle *)0x14d6a3);
    CEAngle::~CEAngle((CEAngle *)0x14d6ad);
    CEAngle::~CEAngle((CEAngle *)0x14d6b7);
    CEAngle::~CEAngle((CEAngle *)0x14d6c4);
    CEAngle::~CEAngle((CEAngle *)0x14d6d1);
    CVar5.angle_ = extraout_XMM0_Qa_01;
    CVar5._vptr_CEAngle = (_func_int **)xcoord_first;
    return CVar5;
  }
  local_72 = 1;
  uVar4 = __cxa_allocate_exception(0xa8);
  paVar6 = &local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_38,"CECoordinates::AngularSeparation(CECoords&, CECoords&)",paVar6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"Supplied coordinates are in different frames",&local_71);
  CEException::invalid_value::invalid_value
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (string *)CONCAT44(CVar2,in_stack_ffffffffffffff00));
  local_72 = 0;
  __cxa_throw(uVar4,&CEException::invalid_value::typeinfo,CEException::invalid_value::~invalid_value
             );
}

Assistant:

CEAngle CECoordinates::AngularSeparation(const CECoordinates& coords1, 
                                         const CECoordinates& coords2)
{
    // Make sure the coordinates are in the same frame
    if (coords1.GetCoordSystem() != coords2.GetCoordSystem()) {
        throw CEException::invalid_value("CECoordinates::AngularSeparation(CECoords&, CECoords&)",
                                         "Supplied coordinates are in different frames");
    }

    // Get the appropriate Y-Coordinates
    double y1 = coords1.YCoordinate_Rad();
    double y2 = coords2.YCoordinate_Rad();
    if (coords1.GetCoordSystem() == CECoordinateType::OBSERVED) {
        y1 = M_PI_2 - y1;
        y2 = M_PI_2 - y2;
    }

    // Convert the second coordinates to be the same type as the first set of coordinates
    CEAngle angsep = AngularSeparation(coords1.XCoord(), y1,
                                       coords2.XCoord(), y2) ;
    
    return angsep ;
}